

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

Vec_Int_t * Gia_ManDetectFullAdders(Gia_Man_t *p,int fVerbose,Vec_Int_t **pvCutsXor2)

{
  ulong uVar1;
  Vec_Int_t *vFadds;
  Gia_Man_t *p_00;
  Vec_Int_t *vCutsMaj;
  Vec_Int_t *vCutsXor;
  
  Dtc_ManComputeCuts(p,pvCutsXor2,&vCutsXor,&vCutsMaj,fVerbose);
  qsort(vCutsXor->pArray,(long)(vCutsXor->nSize / 4),0x10,Dtc_ManCompare);
  p_00 = (Gia_Man_t *)vCutsMaj->pArray;
  qsort(p_00,(long)(vCutsMaj->nSize / 4),0x10,Dtc_ManCompare);
  vFadds = Dtc_ManFindCommonCuts(p_00,vCutsXor,vCutsMaj);
  uVar1 = (long)vFadds->nSize / 5;
  qsort(vFadds->pArray,(long)(int)uVar1,0x14,Dtc_ManCompare2);
  if (fVerbose != 0) {
    printf("XOR3 cuts = %d.  MAJ cuts = %d.  Full-adders = %d.\n",
           (long)vCutsXor->nSize / 4 & 0xffffffff,(long)vCutsMaj->nSize / 4 & 0xffffffff,
           uVar1 & 0xffffffff);
    Dtc_ManPrintFadds(vFadds);
  }
  Vec_IntFree(vCutsXor);
  Vec_IntFree(vCutsMaj);
  return vFadds;
}

Assistant:

Vec_Int_t * Gia_ManDetectFullAdders( Gia_Man_t * p, int fVerbose, Vec_Int_t ** pvCutsXor2 )
{
    Vec_Int_t * vCutsXor, * vCutsMaj, * vFadds;
    Dtc_ManComputeCuts( p, pvCutsXor2, &vCutsXor, &vCutsMaj, fVerbose );
    qsort( Vec_IntArray(vCutsXor), (size_t)(Vec_IntSize(vCutsXor)/4), 16, (int (*)(const void *, const void *))Dtc_ManCompare );
    qsort( Vec_IntArray(vCutsMaj), (size_t)(Vec_IntSize(vCutsMaj)/4), 16, (int (*)(const void *, const void *))Dtc_ManCompare );
    vFadds = Dtc_ManFindCommonCuts( p, vCutsXor, vCutsMaj );
    qsort( Vec_IntArray(vFadds), (size_t)(Vec_IntSize(vFadds)/5), 20, (int (*)(const void *, const void *))Dtc_ManCompare2 );
    if ( fVerbose )
        printf( "XOR3 cuts = %d.  MAJ cuts = %d.  Full-adders = %d.\n", Vec_IntSize(vCutsXor)/4, Vec_IntSize(vCutsMaj)/4, Vec_IntSize(vFadds)/5 );
    if ( fVerbose )
        Dtc_ManPrintFadds( vFadds );
    Vec_IntFree( vCutsXor );
    Vec_IntFree( vCutsMaj );
    return vFadds;
}